

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSign.c
# Opt level: O1

double * Cudd_CofMinterm(DdManager *dd,DdNode *node)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  st__table *table;
  double *__ptr;
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  table = st__init_table(st__ptrcmp,st__ptrhash);
  if (table == (st__table *)0x0) {
    lVar4 = 0x268;
    goto LAB_0078f16b;
  }
  size = dd->size;
  __ptr = ddCofMintermAux(dd,node,table);
  iVar3 = size;
  if (__ptr == (double *)0x0) {
LAB_0078f12c:
    pdVar5 = (double *)0x0;
  }
  else {
    uVar8 = (ulong)(uint)size;
    lVar4 = (long)size;
    pdVar5 = (double *)malloc(lVar4 * 8 + 8);
    if (pdVar5 == (double *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
      goto LAB_0078f12c;
    }
    uVar1 = *(uint *)((ulong)node & 0xfffffffffffffffe);
    uVar6 = (ulong)uVar1;
    iVar7 = 1;
    if (uVar6 != 0x7fffffff) {
      iVar7 = dd->perm[uVar6];
    }
    if (0 < iVar3) {
      piVar2 = dd->invperm;
      uVar9 = 0;
      do {
        lVar10 = 0x7fffffff;
        if (uVar1 != 0x7fffffff) {
          lVar10 = (long)dd->perm[uVar6];
        }
        lVar11 = (long)(iVar3 - iVar7);
        if (lVar10 <= (long)uVar9) {
          lVar11 = uVar9 - (long)iVar7;
        }
        pdVar5[piVar2[uVar9]] = __ptr[lVar11];
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    pdVar5[lVar4] = __ptr[iVar3 - iVar7];
  }
  if ((__ptr != (double *)0x0) && (*(int *)(((ulong)node & 0xfffffffffffffffe) + 4) == 1)) {
    free(__ptr);
  }
  st__foreach(table,cuddStCountfree,(char *)0x0);
  st__free_table(table);
  if (pdVar5 != (double *)0x0) {
    return pdVar5;
  }
  lVar4 = 0x260;
LAB_0078f16b:
  fwrite("out-of-memory, couldn\'t measure DD cofactors.\n",0x2e,1,
         *(FILE **)((long)&(dd->sentinel).index + lVar4));
  dd->errorCode = CUDD_MEMORY_OUT;
  return (double *)0x0;
}

Assistant:

double *
Cudd_CofMinterm(
  DdManager * dd,
  DdNode * node)
{
    st__table    *table;
    double      *values;
    double      *result = NULL;
    int         i, firstLevel;

#ifdef DD_STATS
    long startTime;
    startTime = util_cpu_time();
    num_calls = 0;
    table_mem = sizeof( st__table);
#endif

    table = st__init_table( st__ptrcmp, st__ptrhash);
    if (table == NULL) {
        (void) fprintf(dd->err,
                       "out-of-memory, couldn't measure DD cofactors.\n");
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    size = dd->size;
    values = ddCofMintermAux(dd, node, table);
    if (values != NULL) {
        result = ABC_ALLOC(double,size + 1);
        if (result != NULL) {
#ifdef DD_STATS
            table_mem += (size + 1) * sizeof(double);
#endif
            if (Cudd_IsConstant(node))
                firstLevel = 1;
            else
                firstLevel = cuddI(dd,Cudd_Regular(node)->index);
            for (i = 0; i < size; i++) {
                if (i >= cuddI(dd,Cudd_Regular(node)->index)) {
                    result[dd->invperm[i]] = values[i - firstLevel];
                } else {
                    result[dd->invperm[i]] = values[size - firstLevel];
                }
            }
            result[size] = values[size - firstLevel];
        } else {
            dd->errorCode = CUDD_MEMORY_OUT;
        }
    }

#ifdef DD_STATS
    table_mem += table->num_bins * sizeof( st__table_entry *);
#endif
    if (Cudd_Regular(node)->ref == 1) ABC_FREE(values);
    st__foreach(table, cuddStCountfree, NULL);
    st__free_table(table);
#ifdef DD_STATS
    (void) fprintf(dd->out,"Number of calls: %d\tTable memory: %d bytes\n",
                  num_calls, table_mem);
    (void) fprintf(dd->out,"Time to compute measures: %s\n",
                  util_print_time(util_cpu_time() - startTime));
#endif
    if (result == NULL) {
        (void) fprintf(dd->out,
                       "out-of-memory, couldn't measure DD cofactors.\n");
        dd->errorCode = CUDD_MEMORY_OUT;
    }
    return(result);

}